

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

tm * __thiscall
spdlog::pattern_formatter::get_time_
          (tm *__return_storage_ptr__,pattern_formatter *this,log_msg *msg)

{
  long local_10;
  
  if (this->pattern_time_type_ == local) {
    local_10 = (msg->time).__d.__r / 1000000000;
    localtime_r(&local_10,(tm *)__return_storage_ptr__);
  }
  else {
    local_10 = (msg->time).__d.__r / 1000000000;
    gmtime_r(&local_10,(tm *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE std::tm pattern_formatter::get_time_(const details::log_msg &msg)
{
    if (pattern_time_type_ == pattern_time_type::local)
    {
        return details::os::localtime(log_clock::to_time_t(msg.time));
    }
    return details::os::gmtime(log_clock::to_time_t(msg.time));
}